

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::MaybePunishNodeForBlock
          (PeerManagerImpl *this,NodeId nodeid,BlockValidationState *state,bool via_compact_block,
          string *message)

{
  bool bVar1;
  int iVar2;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  PeerRef PVar3;
  string_view logging_function;
  PeerRef peer;
  NodeId nodeid_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  nodeid_local = nodeid;
  PVar3 = GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
  switch((state->super_ValidationState<BlockValidationResult>).m_result) {
  case BLOCK_CONSENSUS:
  case BLOCK_MUTATED:
    if (!via_compact_block) goto switchD_008e8e28_caseD_4;
    break;
  case BLOCK_CACHED_INVALID:
    if ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0 && !via_compact_block) &&
       ((peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_is_inbound == false)) goto LAB_008e8e38;
    break;
  case BLOCK_INVALID_HEADER:
  case BLOCK_MISSING_PREV:
  case BLOCK_INVALID_PREV:
  case BLOCK_CHECKPOINT:
switchD_008e8e28_caseD_4:
    if (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_008e8ece;
LAB_008e8e38:
    Misbehaving((PeerManagerImpl *)
                peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,(Peer *)message,
                (string *)
                PVar3.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._M_pi);
    goto LAB_008e8ece;
  }
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (message,"");
  if (iVar2 != 0) {
    this_00 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
    if (bVar1) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x62;
      logging_function._M_str = "MaybePunishNodeForBlock";
      logging_function._M_len = 0x17;
      LogPrintFormatInternal<long,std::__cxx11::string>
                (logging_function,source_file,0x7c6,NET,Debug,(ConstevalFormatString<2U>)0xf79649,
                 &nodeid_local,message);
    }
  }
LAB_008e8ece:
  if (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::MaybePunishNodeForBlock(NodeId nodeid, const BlockValidationState& state,
                                              bool via_compact_block, const std::string& message)
{
    PeerRef peer{GetPeerRef(nodeid)};
    switch (state.GetResult()) {
    case BlockValidationResult::BLOCK_RESULT_UNSET:
        break;
    case BlockValidationResult::BLOCK_HEADER_LOW_WORK:
        // We didn't try to process the block because the header chain may have
        // too little work.
        break;
    // The node is providing invalid data:
    case BlockValidationResult::BLOCK_CONSENSUS:
    case BlockValidationResult::BLOCK_MUTATED:
        if (!via_compact_block) {
            if (peer) Misbehaving(*peer, message);
            return;
        }
        break;
    case BlockValidationResult::BLOCK_CACHED_INVALID:
        {
            // Discourage outbound (but not inbound) peers if on an invalid chain.
            // Exempt HB compact block peers. Manual connections are always protected from discouragement.
            if (peer && !via_compact_block && !peer->m_is_inbound) {
                if (peer) Misbehaving(*peer, message);
                return;
            }
            break;
        }
    case BlockValidationResult::BLOCK_INVALID_HEADER:
    case BlockValidationResult::BLOCK_CHECKPOINT:
    case BlockValidationResult::BLOCK_INVALID_PREV:
        if (peer) Misbehaving(*peer, message);
        return;
    // Conflicting (but not necessarily invalid) data or different policy:
    case BlockValidationResult::BLOCK_MISSING_PREV:
        if (peer) Misbehaving(*peer, message);
        return;
    case BlockValidationResult::BLOCK_RECENT_CONSENSUS_CHANGE:
    case BlockValidationResult::BLOCK_TIME_FUTURE:
        break;
    }
    if (message != "") {
        LogDebug(BCLog::NET, "peer=%d: %s\n", nodeid, message);
    }
}